

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_tag_alias_registry.hpp
# Opt level: O0

void __thiscall
Catch::TagAliasRegistry::add(TagAliasRegistry *this,char *alias,char *tag,SourceLineInfo *lineInfo)

{
  SourceLineInfo *pSVar1;
  bool bVar2;
  byte bVar3;
  ostream *poVar4;
  TagAlias *pTVar5;
  domain_error *pdVar6;
  char *pcVar7;
  __enable_if_t<is_constructible<value_type,_pair<const_char_*,_TagAlias>_>::value,_pair<iterator,_bool>_>
  _Var8;
  byte local_5ba;
  allocator local_569;
  string local_568 [32];
  Option<Catch::TagAlias> local_548;
  ostringstream local_4f8 [8];
  ostringstream oss_1;
  SourceLineInfo local_370;
  allocator local_341;
  string local_340 [32];
  TagAlias local_320;
  pair<const_char_*,_Catch::TagAlias> local_2d8;
  _Base_ptr local_288;
  byte local_280;
  undefined1 local_271;
  ostringstream local_250 [8];
  ostringstream oss;
  allocator local_d1;
  string local_d0 [37];
  byte local_ab;
  byte local_aa;
  allocator local_a9;
  string local_a8 [39];
  allocator local_81;
  string local_80 [55];
  allocator local_49;
  string local_48 [32];
  SourceLineInfo *local_28;
  SourceLineInfo *lineInfo_local;
  char *tag_local;
  char *alias_local;
  TagAliasRegistry *this_local;
  
  local_28 = lineInfo;
  lineInfo_local = (SourceLineInfo *)tag;
  tag_local = alias;
  alias_local = (char *)this;
  std::allocator<char>::allocator();
  local_aa = 0;
  local_ab = 0;
  std::__cxx11::string::string(local_48,alias,&local_49);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_80,"[@",&local_81);
  bVar2 = startsWith((string *)local_48,(string *)local_80);
  pcVar7 = tag_local;
  local_5ba = 1;
  if (bVar2) {
    std::allocator<char>::allocator();
    local_aa = 1;
    std::__cxx11::string::string(local_a8,pcVar7,&local_a9);
    local_ab = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_d0,"]",&local_d1);
    bVar2 = endsWith((string *)local_a8,(string *)local_d0);
    local_5ba = bVar2 ^ 0xff;
    std::__cxx11::string::~string(local_d0);
    std::allocator<char>::~allocator((allocator<char> *)&local_d1);
  }
  if ((local_ab & 1) != 0) {
    std::__cxx11::string::~string(local_a8);
  }
  if ((local_aa & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_a9);
  }
  std::__cxx11::string::~string(local_80);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  pSVar1 = lineInfo_local;
  if ((local_5ba & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_340,(char *)pSVar1,&local_341);
    SourceLineInfo::SourceLineInfo(&local_370,local_28);
    TagAlias::TagAlias(&local_320,(string *)local_340,&local_370);
    std::make_pair<char_const*&,Catch::TagAlias>(&local_2d8,&tag_local,&local_320);
    _Var8 = std::
            map<std::__cxx11::string,Catch::TagAlias,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Catch::TagAlias>>>
            ::insert<std::pair<char_const*,Catch::TagAlias>>
                      ((map<std::__cxx11::string,Catch::TagAlias,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Catch::TagAlias>>>
                        *)&this->m_registry,&local_2d8);
    local_288 = (_Base_ptr)_Var8.first._M_node;
    local_280 = _Var8.second;
    bVar3 = local_280 ^ 0xff;
    std::pair<const_char_*,_Catch::TagAlias>::~pair(&local_2d8);
    TagAlias::~TagAlias(&local_320);
    SourceLineInfo::~SourceLineInfo(&local_370);
    std::__cxx11::string::~string(local_340);
    std::allocator<char>::~allocator((allocator<char> *)&local_341);
    if ((bVar3 & 1) == 0) {
      return;
    }
    std::__cxx11::ostringstream::ostringstream(local_4f8);
    poVar4 = std::operator<<((ostream *)local_4f8,"error: tag alias, \"");
    poVar4 = std::operator<<(poVar4,tag_local);
    poVar4 = std::operator<<(poVar4,"\" already registered.\n");
    poVar4 = std::operator<<(poVar4,"\tFirst seen at ");
    pcVar7 = tag_local;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_568,pcVar7,&local_569);
    (*(this->super_ITagAliasRegistry)._vptr_ITagAliasRegistry[2])(&local_548,this,local_568);
    pTVar5 = Option<Catch::TagAlias>::operator->(&local_548);
    poVar4 = Catch::operator<<(poVar4,&pTVar5->lineInfo);
    poVar4 = std::operator<<(poVar4,"\n");
    poVar4 = std::operator<<(poVar4,"\tRedefined at ");
    Catch::operator<<(poVar4,local_28);
    Option<Catch::TagAlias>::~Option(&local_548);
    std::__cxx11::string::~string(local_568);
    std::allocator<char>::~allocator((allocator<char> *)&local_569);
    pdVar6 = (domain_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    pcVar7 = (char *)std::__cxx11::string::c_str();
    std::domain_error::domain_error(pdVar6,pcVar7);
    __cxa_throw(pdVar6,&std::domain_error::typeinfo,std::domain_error::~domain_error);
  }
  std::__cxx11::ostringstream::ostringstream(local_250);
  poVar4 = std::operator<<((ostream *)local_250,"error: tag alias, \"");
  poVar4 = std::operator<<(poVar4,tag_local);
  poVar4 = std::operator<<(poVar4,"\" is not of the form [@alias name].\n");
  Catch::operator<<(poVar4,local_28);
  local_271 = 1;
  pdVar6 = (domain_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::ostringstream::str();
  pcVar7 = (char *)std::__cxx11::string::c_str();
  std::domain_error::domain_error(pdVar6,pcVar7);
  local_271 = 0;
  __cxa_throw(pdVar6,&std::domain_error::typeinfo,std::domain_error::~domain_error);
}

Assistant:

void TagAliasRegistry::add( char const* alias, char const* tag, SourceLineInfo const& lineInfo ) {

        if( !startsWith( alias, "[@" ) || !endsWith( alias, "]" ) ) {
            std::ostringstream oss;
            oss << "error: tag alias, \"" << alias << "\" is not of the form [@alias name].\n" << lineInfo;
            throw std::domain_error( oss.str().c_str() );
        }
        if( !m_registry.insert( std::make_pair( alias, TagAlias( tag, lineInfo ) ) ).second ) {
            std::ostringstream oss;
            oss << "error: tag alias, \"" << alias << "\" already registered.\n"
                << "\tFirst seen at " << find(alias)->lineInfo << "\n"
                << "\tRedefined at " << lineInfo;
            throw std::domain_error( oss.str().c_str() );
        }
    }